

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnWriteVer.c
# Opt level: O0

void Wln_WriteTableOne(FILE *pFile,int nFans,int nOuts,word *pTable,int Id)

{
  ulong uVar1;
  word wVar2;
  uint local_28;
  int nMints;
  int m;
  int Id_local;
  word *pTable_local;
  int nOuts_local;
  int nFans_local;
  FILE *pFile_local;
  
  if (((0 < nOuts) && (nOuts < 0x41)) && ((int)(0x40 % (long)nOuts) == 0)) {
    fprintf((FILE *)pFile,"module table%d(ind, val);\n",(ulong)(uint)Id);
    fprintf((FILE *)pFile,"  input  [%d:0] ind;\n",(ulong)(nFans - 1));
    fprintf((FILE *)pFile,"  output [%d:0] val;\n",(ulong)(nOuts - 1));
    fprintf((FILE *)pFile,"  reg    [%d:0] val;\n",(ulong)(nOuts - 1));
    fprintf((FILE *)pFile,"  always @(ind)\n");
    fprintf((FILE *)pFile,"  begin\n");
    fprintf((FILE *)pFile,"    case (ind)\n");
    for (local_28 = 0; (int)local_28 < 1 << ((byte)nFans & 0x1f); local_28 = local_28 + 1) {
      uVar1 = pTable[(int)(nOuts * local_28) >> 6];
      wVar2 = Abc_Tt6Mask(nOuts);
      fprintf((FILE *)pFile,"      %d\'h%x: val = %d\'h%x;\n",(ulong)(uint)nFans,(ulong)local_28,
              (ulong)(uint)nOuts,
              (ulong)((uint)(uVar1 >> ((char)nOuts * (char)local_28 & 0x3fU)) & (uint)wVar2));
    }
    fprintf((FILE *)pFile,"    endcase\n");
    fprintf((FILE *)pFile,"  end\n");
    fprintf((FILE *)pFile,"endmodule\n");
    fprintf((FILE *)pFile,"\n");
    return;
  }
  __assert_fail("nOuts > 0 && nOuts <= 64 && (64 % nOuts) == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/wln/wlnWriteVer.c"
                ,0x31,"void Wln_WriteTableOne(FILE *, int, int, word *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Wln_WriteTableOne( FILE * pFile, int nFans, int nOuts, word * pTable, int Id )
{
    int m, nMints = (1<<nFans);
//    Abc_TtPrintHexArrayRev( stdout, pTable, nMints );  printf( "\n" );
    assert( nOuts > 0 && nOuts <= 64 && (64 % nOuts) == 0 );
    fprintf( pFile, "module table%d(ind, val);\n", Id );
    fprintf( pFile, "  input  [%d:0] ind;\n", nFans-1 );
    fprintf( pFile, "  output [%d:0] val;\n", nOuts-1 );
    fprintf( pFile, "  reg    [%d:0] val;\n", nOuts-1 );
    fprintf( pFile, "  always @(ind)\n" );
    fprintf( pFile, "  begin\n" );
    fprintf( pFile, "    case (ind)\n" );
    for ( m = 0; m < nMints; m++ )
    fprintf( pFile, "      %d\'h%x: val = %d\'h%x;\n", nFans, m, nOuts, (unsigned)((pTable[(nOuts * m) >> 6] >> ((nOuts * m) & 63)) & Abc_Tt6Mask(nOuts)) );
    fprintf( pFile, "    endcase\n" );
    fprintf( pFile, "  end\n" );
    fprintf( pFile, "endmodule\n" );
    fprintf( pFile, "\n" );
}